

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-op-vec.c
# Opt level: O1

void tcg_gen_cmp_vec_x86_64
               (TCGContext *tcg_ctx,TCGCond cond,uint vece,TCGv_vec r,TCGv_vec a,TCGv_vec b)

{
  uint uVar1;
  int iVar2;
  TCGOp *pTVar3;
  undefined4 in_register_00000034;
  TCGType type;
  uintptr_t o_1;
  uintptr_t o_2;
  
  uVar1 = *(uint *)(r + (long)&tcg_ctx->pool_cur);
  type = uVar1 >> 0x10 & 0xff;
  iVar2 = tcg_can_emit_vec_op_x86_64(tcg_ctx,INDEX_op_cmp_vec,type,vece);
  if (iVar2 < 1) {
    tcg_expand_vec_op_x86_64
              (tcg_ctx,INDEX_op_cmp_vec,type,vece,(TCGArg)(r + (long)&tcg_ctx->pool_cur),
               a + (long)tcg_ctx,b + (long)tcg_ctx,CONCAT44(in_register_00000034,cond));
  }
  else {
    pTVar3 = tcg_emit_op_x86_64(tcg_ctx,INDEX_op_cmp_vec);
    pTVar3->field_0x1 =
         (byte)((vece << 0xc) >> 8) | (byte)((uVar1 >> 0x10) * 0x100 + 0xe00 >> 8) & 0xf;
    pTVar3->args[0] = (TCGArg)(r + (long)&tcg_ctx->pool_cur);
    pTVar3->args[1] = (TCGArg)(a + (long)tcg_ctx);
    pTVar3->args[2] = (TCGArg)(b + (long)tcg_ctx);
    pTVar3->args[3] = (ulong)cond;
  }
  return;
}

Assistant:

void tcg_gen_cmp_vec(TCGContext *tcg_ctx, TCGCond cond, unsigned vece,
                     TCGv_vec r, TCGv_vec a, TCGv_vec b)
{
    TCGTemp *rt = tcgv_vec_temp(tcg_ctx, r);
    TCGTemp *at = tcgv_vec_temp(tcg_ctx, a);
    TCGTemp *bt = tcgv_vec_temp(tcg_ctx, b);
    TCGArg ri = temp_arg(rt);
    TCGArg ai = temp_arg(at);
    TCGArg bi = temp_arg(bt);
    TCGType type = rt->base_type;
    int can;

    tcg_debug_assert(at->base_type >= type);
    tcg_debug_assert(bt->base_type >= type);
    tcg_assert_listed_vecop(INDEX_op_cmp_vec);
    can = tcg_can_emit_vec_op(tcg_ctx, INDEX_op_cmp_vec, type, vece);
    if (can > 0) {
        vec_gen_4(tcg_ctx, INDEX_op_cmp_vec, type, vece, ri, ai, bi, cond);
    } else {
        const TCGOpcode *hold_list = tcg_swap_vecop_list(NULL);
        tcg_debug_assert(can < 0);
        tcg_expand_vec_op(tcg_ctx, INDEX_op_cmp_vec, type, vece, ri, ai, bi, cond);
        tcg_swap_vecop_list(hold_list);
    }
}